

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

int __thiscall QUnifiedTimer::closestPausedAnimationTimerTimeToFinish(QUnifiedTimer *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (*(long *)(this + 0xb0) != 0) {
    iVar2 = 0x7fffffff;
    lVar3 = 0;
    do {
      iVar1 = *(int *)(*(long *)(*(long *)(this + 0xa8) + lVar3) + 0x14);
      if (iVar1 < iVar2) {
        iVar2 = iVar1;
      }
      lVar3 = lVar3 + 8;
    } while (*(long *)(this + 0xb0) << 3 != lVar3);
    return iVar2;
  }
  return 0x7fffffff;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }